

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_gfx_read_screen_pixels(rf_color *dst,int width,int height)

{
  long local_28;
  rf_int x;
  rf_int y;
  int height_local;
  int width_local;
  rf_color *dst_local;
  
  (*(rf__ctx->field_0).gfx_ctx.gl.ReadPixels)(0,0,width,height,0x1908,0x1401,dst);
  for (x = (rf_int)(height + -1); -1 < x; x = x + -1) {
    for (local_28 = 0; local_28 < width; local_28 = local_28 + 1) {
      dst[((height + -1) - x) * (long)width + local_28] = dst[x * width + local_28];
      if ((local_28 + 1) % 4 == 0) {
        dst[((height + -1) - x) * (long)width + local_28].a = 0xff;
      }
    }
  }
  return;
}

Assistant:

RF_API void rf_gfx_read_screen_pixels(rf_color* dst, int width, int height)
{
    // NOTE 1: glReadPixels returns image flipped vertically -> (0,0) is the bottom left corner of the framebuffer
    // NOTE 2: We are getting alpha channel! Be careful, it can be transparent if not cleared properly!
    rf_gl.ReadPixels(0, 0, width, height, GL_RGBA, GL_UNSIGNED_BYTE, dst);

    for (rf_int y = height - 1; y >= 0; y--)
    {
        for (rf_int x = 0; x < width; x++)
        {
            dst[((height - 1) - y) * width + x] = dst[(y * width) + x]; // Flip line

            // Set alpha component value to 255 (no trasparent image retrieval)
            // NOTE: Alpha value has already been applied to RGB in framebuffer, we don't need it!
            if (((x + 1) % 4) == 0) dst[((height - 1) - y) * width + x].a = 255;
        }
    }
}